

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  int *piVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  ImDrawChannel *pIVar8;
  void *pvVar9;
  ImVec4 *pIVar10;
  ImGuiContext *pIVar11;
  ImDrawChannel *__dest;
  long lVar12;
  void *pvVar13;
  void *__dest_00;
  char *__function;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  
  pIVar11 = GImGui;
  if ((this->_ChannelsCurrent != 0) || (this->_ChannelsCount != 1)) {
    __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x114,"void ImDrawList::ChannelsSplit(int)");
  }
  iVar7 = (this->_Channels).Size;
  if (iVar7 < channels_count) {
    iVar17 = (this->_Channels).Capacity;
    if (iVar17 < channels_count) {
      if (iVar17 == 0) {
        iVar19 = 8;
      }
      else {
        iVar19 = iVar17 / 2 + iVar17;
      }
      if (iVar19 <= channels_count) {
        iVar19 = channels_count;
      }
      if (iVar17 < iVar19) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (ImDrawChannel *)(*(pIVar11->IO).MemAllocFn)((long)iVar19 << 5);
        pIVar8 = (this->_Channels).Data;
        if (pIVar8 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar8,(long)(this->_Channels).Size << 5);
        }
        pIVar8 = (this->_Channels).Data;
        if (pIVar8 != (ImDrawChannel *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar8);
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar19;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_ChannelsCount = channels_count;
  if ((this->_Channels).Size < 1) {
LAB_0014c34d:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x353,"value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]")
    ;
  }
  pIVar8 = (this->_Channels).Data;
  (pIVar8->IdxBuffer).Size = 0;
  (pIVar8->IdxBuffer).Capacity = 0;
  (pIVar8->IdxBuffer).Data = (unsigned_short *)0x0;
  (pIVar8->CmdBuffer).Size = 0;
  (pIVar8->CmdBuffer).Capacity = 0;
  (pIVar8->CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar18 = 1;
    lVar15 = 0x38;
    do {
      pIVar11 = GImGui;
      lVar12 = (long)(this->_Channels).Size;
      if ((long)uVar18 < (long)iVar7) {
        if (lVar12 <= (long)uVar18) goto LAB_0014c34d;
        pIVar8 = (this->_Channels).Data;
        iVar17 = *(int *)((long)pIVar8 + lVar15 + -0x14);
        if (iVar17 < 0) {
          uVar16 = iVar17 / 2 + iVar17;
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pvVar13 = (*(pIVar11->IO).MemAllocFn)((ulong)uVar16 * 0x30);
          pvVar9 = *(void **)((long)pIVar8 + lVar15 + -0x10);
          if (pvVar9 != (void *)0x0) {
            memcpy(pvVar13,pvVar9,(long)*(int *)((long)pIVar8 + lVar15 + -0x18) * 0x30);
          }
          pvVar9 = *(void **)((long)pIVar8 + lVar15 + -0x10);
          if (pvVar9 != (void *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pvVar9);
          *(void **)((long)pIVar8 + lVar15 + -0x10) = pvVar13;
          *(uint *)((long)pIVar8 + lVar15 + -0x14) = uVar16;
        }
        *(undefined4 *)((long)pIVar8 + lVar15 + -0x18) = 0;
        pIVar11 = GImGui;
        if ((long)(this->_Channels).Size <= (long)uVar18) goto LAB_0014c34d;
        pIVar8 = (this->_Channels).Data;
        iVar17 = *(int *)((long)pIVar8 + lVar15 + -4);
        if (iVar17 < 0) {
          iVar17 = iVar17 / 2 + iVar17;
          if (iVar17 < 1) {
            iVar17 = 0;
          }
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pvVar13 = (*(pIVar11->IO).MemAllocFn)((ulong)(uint)(iVar17 * 2));
          pvVar9 = *(void **)((long)&(pIVar8->CmdBuffer).Size + lVar15);
          if (pvVar9 != (void *)0x0) {
            memcpy(pvVar13,pvVar9,(long)*(int *)((long)pIVar8 + lVar15 + -8) * 2);
          }
          pvVar9 = *(void **)((long)&(pIVar8->CmdBuffer).Size + lVar15);
          if (pvVar9 != (void *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pvVar9);
          *(void **)((long)&(pIVar8->CmdBuffer).Size + lVar15) = pvVar13;
          *(int *)((long)pIVar8 + lVar15 + -4) = iVar17;
        }
        *(undefined4 *)((long)pIVar8 + lVar15 + -8) = 0;
      }
      else {
        if (lVar12 <= (long)uVar18) goto LAB_0014c34d;
        pIVar8 = (this->_Channels).Data;
        puVar2 = (undefined8 *)((long)pIVar8 + lVar15 + -8);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pIVar8 + lVar15 + -0x18);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      pIVar11 = GImGui;
      if ((long)(this->_Channels).Size <= (long)uVar18) goto LAB_0014c34d;
      pIVar8 = (this->_Channels).Data;
      if (*(int *)((long)pIVar8 + lVar15 + -0x18) == 0) {
        lVar12 = (long)(this->_ClipRectStack).Size;
        if (lVar12 < 1) {
          __function = "value_type &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_0014c398:
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x35d,__function);
        }
        lVar14 = (long)(this->_TextureIdStack).Size;
        if (lVar14 < 1) {
          __function = "value_type &ImVector<void *>::back() [T = void *]";
          goto LAB_0014c398;
        }
        pIVar10 = (this->_ClipRectStack).Data;
        fVar3 = pIVar10[lVar12 + -1].x;
        fVar4 = pIVar10[lVar12 + -1].y;
        fVar5 = pIVar10[lVar12 + -1].z;
        fVar6 = pIVar10[lVar12 + -1].w;
        pvVar9 = (this->_TextureIdStack).Data[lVar14 + -1];
        if (*(int *)((long)pIVar8 + lVar15 + -0x14) == 0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          __dest_00 = (*(pIVar11->IO).MemAllocFn)(0x180);
          pvVar13 = *(void **)((long)pIVar8 + lVar15 + -0x10);
          if (pvVar13 != (void *)0x0) {
            memcpy(__dest_00,pvVar13,(long)*(int *)((long)pIVar8 + lVar15 + -0x18) * 0x30);
          }
          pvVar13 = *(void **)((long)pIVar8 + lVar15 + -0x10);
          if (pvVar13 != (void *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pvVar13);
          *(void **)((long)pIVar8 + lVar15 + -0x10) = __dest_00;
          *(undefined4 *)((long)pIVar8 + lVar15 + -0x14) = 8;
        }
        lVar12 = *(long *)((long)pIVar8 + lVar15 + -0x10);
        iVar17 = *(int *)((long)pIVar8 + lVar15 + -0x18);
        *(int *)((long)pIVar8 + lVar15 + -0x18) = iVar17 + 1;
        lVar14 = (long)iVar17 * 0x30;
        *(undefined4 *)(lVar12 + lVar14) = 0;
        *(float *)(lVar12 + 4 + lVar14) = fVar3;
        *(float *)(lVar12 + 8 + lVar14) = fVar4;
        *(float *)(lVar12 + 0xc + lVar14) = fVar5;
        *(float *)(lVar12 + 0x10 + lVar14) = fVar6;
        *(void **)(lVar12 + 0x18 + lVar14) = pvVar9;
        puVar2 = (undefined8 *)(lVar12 + 0x20 + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
      }
      uVar18 = uVar18 + 1;
      lVar15 = lVar15 + 0x20;
    } while ((uint)channels_count != uVar18);
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}